

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAndConesLimit(Gia_Man_t *p,int *pAnds,int nAnds,int Level)

{
  int iVar1;
  char *pcVar2;
  Gia_Man_t *pNew;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  
  pNew = Gia_ManStart(1000);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar2);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar2);
  }
  pNew->pName = pcVar4;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar2);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar2);
  }
  pNew->pSpec = pcVar4;
  Gia_ManLevelNum(p);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < nAnds) {
    uVar5 = 0;
    do {
      Gia_ManDupAndConesLimit_rec(pNew,p,pAnds[uVar5],Level);
      uVar5 = uVar5 + 1;
    } while ((uint)nAnds != uVar5);
    if (0 < nAnds) {
      uVar5 = 0;
      do {
        iVar1 = pAnds[uVar5];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Gia_ManAppendCo(pNew,p->pObjs[iVar1].Value);
        uVar5 = uVar5 + 1;
      } while ((uint)nAnds != uVar5);
    }
  }
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManDupAndConesLimit( Gia_Man_t * p, int * pAnds, int nAnds, int Level )
{
    Gia_Man_t * pNew;
    int i;
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManLevelNum( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nAnds; i++ )
        Gia_ManDupAndConesLimit_rec( pNew, p, pAnds[i], Level );
    for ( i = 0; i < nAnds; i++ )
        Gia_ManAppendCo( pNew, Gia_ManObj(p, pAnds[i])->Value );
    return pNew;
}